

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeBlocksGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,string *make,
          char *makefile,string *target)

{
  bool bVar1;
  char *path;
  char *path_00;
  undefined1 local_108 [8];
  string makefileName_2;
  string local_e0 [8];
  string makefileName_1;
  string local_a8;
  undefined1 local_88 [8];
  string makefileName;
  undefined1 local_58 [8];
  string generator;
  string *target_local;
  char *makefile_local;
  string *make_local;
  cmExtraCodeBlocksGenerator *this_local;
  string *command;
  
  generator.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)make);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[2])
            (local_58);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,"NMake Makefiles");
  if (bVar1) {
    cmSystemTools::ConvertToOutputPath_abi_cxx11_((string *)local_88,(cmSystemTools *)makefile,path)
    ;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," /NOLOGO /f ");
    cmXMLSafe::cmXMLSafe((cmXMLSafe *)((long)&makefileName_1.field_2 + 8),(string *)local_88);
    cmXMLSafe::str_abi_cxx11_(&local_a8,(cmXMLSafe *)((long)&makefileName_1.field_2 + 8));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," VERBOSE=1 ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)target);
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,"MinGW Makefiles");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e0,makefile,(allocator *)(makefileName_2.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator
                ((allocator<char> *)(makefileName_2.field_2._M_local_buf + 0xf));
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," -f &quot;");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_e0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&quot; ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," VERBOSE=1 ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)target);
      std::__cxx11::string::~string(local_e0);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"Ninja");
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," -v ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)target);
      }
      else {
        cmSystemTools::ConvertToOutputPath_abi_cxx11_
                  ((string *)local_108,(cmSystemTools *)makefile,path_00);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," -f &quot;");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_108);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&quot; ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," VERBOSE=1 ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)target);
        std::__cxx11::string::~string((string *)local_108);
      }
    }
  }
  generator.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_58);
  if ((generator.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::BuildMakeCommand(
             const std::string& make, const char* makefile,
             const std::string& target)
{
  std::string command = make;
  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles")
    {
    // For Windows ConvertToOutputPath already adds quotes when required.
    // These need to be escaped, see
    // http://public.kitware.com/Bug/view.php?id=13952
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += " /NOLOGO /f ";
    command += cmXMLSafe(makefileName).str();
    command += " VERBOSE=1 ";
    command += target;
    }
  else if (generator == "MinGW Makefiles")
    {
    // no escaping of spaces in this case, see
    // http://public.kitware.com/Bug/view.php?id=10014
    std::string makefileName = makefile;
    command += " -f &quot;";
    command += makefileName;
    command += "&quot; ";
    command += " VERBOSE=1 ";
    command += target;
    }
  else if (generator == "Ninja")
    {
    command += " -v ";
    command += target;
    }
  else
    {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += " -f &quot;";
    command += makefileName;
    command += "&quot; ";
    command += " VERBOSE=1 ";
    command += target;
    }
  return command;
}